

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SemanticFacts.cpp
# Opt level: O2

PulseStyleKind slang::ast::SemanticFacts::getPulseStyleKind(TokenKind kind)

{
  PulseStyleKind PVar1;
  undefined2 in_register_0000003a;
  int iVar2;
  
  iVar2 = CONCAT22(in_register_0000003a,kind);
  if (iVar2 == 0xe1) {
    return NoShowCancelled;
  }
  if (iVar2 == 0x115) {
    PVar1 = ShowCancelled;
  }
  else {
    if (iVar2 == 0xf7) {
      return OnEvent;
    }
    PVar1 = OnDetect;
  }
  return PVar1;
}

Assistant:

PulseStyleKind SemanticFacts::getPulseStyleKind(TokenKind kind) {
    switch (kind) {
        case TokenKind::PulseStyleOnEventKeyword: return PulseStyleKind::OnEvent;
        case TokenKind::PulseStyleOnDetectKeyword: return PulseStyleKind::OnDetect;
        case TokenKind::ShowCancelledKeyword: return PulseStyleKind::ShowCancelled;
        case TokenKind::NoShowCancelledKeyword: return PulseStyleKind::NoShowCancelled;
        default: SLANG_UNREACHABLE;
    }
}